

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O3

TableDeleteState * __thiscall
duckdb::InsertLocalState::GetDeleteState
          (InsertLocalState *this,DataTable *table,TableCatalogEntry *table_ref,
          ClientContext *context)

{
  _Head_base<0UL,_duckdb::TableDeleteState_*,_false> __ptr;
  _Head_base<0UL,_duckdb::TableDeleteState_*,_false> _Var1;
  type pTVar2;
  _Head_base<0UL,_duckdb::TableDeleteState_*,_false> local_20;
  
  if ((this->delete_state).
      super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
      .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl ==
      (TableDeleteState *)0x0) {
    DataTable::InitializeDelete
              ((DataTable *)&stack0xffffffffffffffe0,(TableCatalogEntry *)table,
               (ClientContext *)table_ref,
               (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)context);
    _Var1._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (TableDeleteState *)0x0;
    __ptr._M_head_impl =
         (this->delete_state).
         super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
         .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl;
    (this->delete_state).
    super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
    .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl = _Var1._M_head_impl;
    if (__ptr._M_head_impl != (TableDeleteState *)0x0) {
      ::std::default_delete<duckdb::TableDeleteState>::operator()
                ((default_delete<duckdb::TableDeleteState> *)&this->delete_state,__ptr._M_head_impl)
      ;
      if ((element_type *)local_20._M_head_impl != (element_type *)0x0) {
        ::std::default_delete<duckdb::TableDeleteState>::operator()
                  ((default_delete<duckdb::TableDeleteState> *)&stack0xffffffffffffffe0,
                   local_20._M_head_impl);
      }
    }
  }
  pTVar2 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
           ::operator*(&this->delete_state);
  return pTVar2;
}

Assistant:

TableDeleteState &InsertLocalState::GetDeleteState(DataTable &table, TableCatalogEntry &table_ref,
                                                   ClientContext &context) {
	if (!delete_state) {
		delete_state = table.InitializeDelete(table_ref, context, bound_constraints);
	}
	return *delete_state;
}